

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::vtextprintf(loguru *this,char *format,__va_list_tag *vlist)

{
  int iVar1;
  char *pcStack_28;
  int result;
  char *buff;
  __va_list_tag *vlist_local;
  char *format_local;
  
  pcStack_28 = (char *)0x0;
  buff = (char *)vlist;
  vlist_local = (__va_list_tag *)format;
  format_local = (char *)this;
  iVar1 = vasprintf(&stack0xffffffffffffffd8,format,vlist);
  if (iVar1 < 0) {
    log_and_abort(0,"CHECK FAILED:  result >= 0  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x17b,"Bad string format: \'%s\'",vlist_local);
  }
  Text::Text((Text *)this,pcStack_28);
  return (Text)(char *)this;
}

Assistant:

static Text vtextprintf(const char* format, va_list vlist)
	{
#ifdef _WIN32
		int bytes_needed = _vscprintf(format, vlist);
		CHECK_F(bytes_needed >= 0, "Bad string format: '%s'", format);
		char* buff = (char*)malloc(bytes_needed+1);
		vsnprintf(buff, bytes_needed+1, format, vlist);
		return Text(buff);
#else
		char* buff = nullptr;
		int result = vasprintf(&buff, format, vlist);
		CHECK_F(result >= 0, "Bad string format: '%s'", format);
		return Text(buff);
#endif
	}